

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void * __thiscall
ft::deque<int,_ft::allocator<int>_>::realloc
          (deque<int,_ft::allocator<int>_> *this,void *__ptr,size_t __size)

{
  map_pointer ppiVar1;
  map_pointer ppvVar2;
  pointer piVar3;
  ulong uVar4;
  pointer piVar5;
  long lVar6;
  pointer piVar7;
  long lVar8;
  ulong uVar9;
  map_pointer ppiVar10;
  size_type sVar11;
  pointer pvVar12;
  size_type sVar13;
  map_pointer ppiVar14;
  
  sVar13 = this->m_map_size + 4;
  ppiVar1 = (map_pointer)operator_new(this->m_map_size * 8 + 0x20);
  uVar4 = sVar13 - this->m_chunks >> 1;
  ppiVar14 = ppiVar1 + uVar4;
  if (sVar13 != 0) {
    ppvVar2 = (this->m_start).m_node;
    lVar6 = (long)(this->m_finish).m_node - (long)ppvVar2;
    lVar8 = 0;
    ppiVar10 = ppiVar1;
    sVar11 = sVar13;
    do {
      if ((lVar8 < (long)uVar4) || ((map_pointer)(lVar6 + (long)ppiVar14) < ppiVar10)) {
        pvVar12 = (pointer)0x0;
      }
      else {
        pvVar12 = *ppvVar2;
        ppvVar2 = ppvVar2 + 1;
      }
      *ppiVar10 = pvVar12;
      lVar8 = lVar8 + 1;
      ppiVar10 = ppiVar10 + 1;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
  }
  operator_delete(this->m_map);
  this->m_map = ppiVar1;
  this->m_map_size = sVar13;
  (this->m_start).m_node = ppiVar14;
  piVar5 = *ppiVar14;
  sVar13 = this->m_size;
  lVar6 = (long)(this->m_start).m_cur - (long)(this->m_start).m_first;
  (this->m_start).m_first = piVar5;
  piVar7 = piVar5 + 0x40;
  (this->m_start).m_last = piVar7;
  pvVar12 = (pointer)((long)piVar5 + lVar6);
  (this->m_start).m_cur = pvVar12;
  uVar4 = (lVar6 >> 2) + sVar13;
  if (uVar4 < 0x40) {
    piVar3 = pvVar12 + sVar13;
  }
  else {
    if ((long)uVar4 < 1) {
      uVar9 = ~uVar4 + 0x3f;
      if ((long)uVar4 < 0) {
        uVar9 = ~uVar4;
      }
      uVar9 = ~((long)uVar9 >> 6);
    }
    else {
      uVar9 = uVar4 >> 6;
    }
    ppiVar14 = ppiVar14 + uVar9;
    piVar5 = *ppiVar14;
    piVar7 = piVar5 + 0x40;
    piVar3 = piVar5 + uVar4 + uVar9 * -0x40;
  }
  (this->m_finish).m_cur = piVar3;
  (this->m_finish).m_first = piVar5;
  (this->m_finish).m_last = piVar7;
  (this->m_finish).m_node = ppiVar14;
  return piVar3;
}

Assistant:

void	realloc() {
		chunk_allocator	chunk_alloc;

		size_type	newMapSize = this->m_map_size + 4;
		map_pointer	newMap = chunk_alloc.allocate(newMapSize);

		map_pointer	tmp_start = newMap + ((newMapSize - this->m_chunks) / 2);

		map_pointer	old_start = this->m_start.m_node;
		map_pointer	old_finish = this->m_finish.m_node;

		size_type	offset = old_finish - old_start;

		map_pointer	tmp = old_start;
		for (size_type i = 0; i < newMapSize; ++i) {
			pointer p = NULL;
			if (newMap + i >= tmp_start && newMap + i <= tmp_start + offset) {
				p = *tmp;
				++tmp;
			}
			chunk_alloc.construct(newMap + i, p);
		}

		for (size_type i = 0; i < this->m_map_size; ++i)
			chunk_alloc.destroy(this->m_map + i);
		chunk_alloc.deallocate(this->m_map, this->m_map_size);

		this->m_map = newMap;
		this->m_map_size = newMapSize;

		offset = this->m_start.m_cur - this->m_start.m_first;

		this->m_start.setNode(tmp_start);
		this->m_start.m_cur = this->m_start.m_first + offset;

		this->m_finish = this->m_start + this->size();
	}